

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O1

int __thiscall
wasm::
TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>
::Selector::select(Selector *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
                  fd_set *__exceptfds,timeval *__timeout)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  GlobalTypeRewriter *pGVar5;
  vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
  *pvVar6;
  pointer pvVar7;
  uint *puVar8;
  iterator iVar9;
  iterator iVar10;
  uint uVar11;
  long lVar12;
  uint *puVar13;
  undefined4 in_register_00000034;
  TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>
  *this_00;
  ulong uVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  key_type local_60;
  HeapType typeA;
  
  this_00 = (TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>
             *)CONCAT44(in_register_00000034,__nfds);
  if (this->count == 0) {
    __assert_fail("count >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                  ,0xde,
                  "Selector wasm::TopologicalOrdersImpl<(lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector::select(TopologicalOrdersImpl<F> &) [Cmp = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)]"
                 );
  }
  if ((ulong)((long)(this_00->buf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this_00->buf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) <
      (ulong)(this->count + this->start)) {
    __assert_fail("start + count <= ctx.buf.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                  ,0xdf,
                  "Selector wasm::TopologicalOrdersImpl<(lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector::select(TopologicalOrdersImpl<F> &) [Cmp = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)]"
                 );
  }
  puVar3 = (this_00->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this_00->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (4 < (long)puVar4 - (long)puVar3) {
    uVar1 = puVar4[-1];
    puVar4[-1] = *puVar3;
    uVar14 = (long)puVar4 + (-4 - (long)puVar3);
    lVar12 = (long)uVar14 >> 2;
    if (lVar12 < 3) {
      lVar16 = 0;
    }
    else {
      lVar15 = 0;
      do {
        uVar2 = puVar3[lVar15 * 2 + 1];
        uVar11 = puVar3[lVar15 * 2 + 2];
        pGVar5 = (this_00->cmp).this;
        pvVar6 = (this_00->cmp).privateSupertypes;
        local_60.id = (pvVar6->
                      super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar2].first.id;
        typeA.id = (pvVar6->
                   super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar11].first.id;
        iVar9 = std::
                _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(pGVar5->wasm->typeIndices)._M_h,&local_60);
        iVar10 = std::
                 _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(pGVar5->wasm->typeIndices)._M_h,&typeA);
        if ((iVar9.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
             _M_cur != (__node_type *)0x0) ==
            (iVar10.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
             _M_cur != (__node_type *)0x0)) {
          if (iVar9.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
              _M_cur != (__node_type *)0x0) {
            if ((*(long *)((long)iVar9.
                                 super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                 ._M_cur + 8) !=
                 *(long *)((long)iVar10.
                                 super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                 ._M_cur + 8)) ||
               (*(uint *)((long)iVar9.
                                super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                ._M_cur + 0x10) !=
                *(uint *)((long)iVar10.
                                super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                ._M_cur + 0x10))) {
              bVar17 = *(uint *)((long)iVar10.
                                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                       ._M_cur + 0x10) <=
                       *(uint *)((long)iVar9.
                                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                       ._M_cur + 0x10);
              goto LAB_00743672;
            }
          }
          bVar17 = uVar11 < uVar2;
        }
        else {
          bVar17 = iVar9.
                   super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
                   _M_cur == (__node_type *)0x0;
        }
LAB_00743672:
        if (bVar17) {
          lVar16 = lVar15 * 2 + 1;
        }
        else {
          lVar16 = lVar15 * 2 + 2;
        }
        puVar3[lVar15] = puVar3[lVar16];
        lVar15 = lVar16;
      } while (lVar16 < (lVar12 - (lVar12 + -1 >> 0x3f)) + -1 >> 1);
    }
    if (((uVar14 & 4) == 0) && (lVar16 == lVar12 + -2 >> 1)) {
      puVar3[lVar16] = puVar3[lVar16 * 2 + 1];
      lVar16 = lVar16 * 2 + 1;
    }
    if (0 < lVar16) {
      do {
        lVar12 = (lVar16 - (lVar16 + -1 >> 0x3f)) + -1 >> 1;
        uVar2 = puVar3[lVar12];
        pGVar5 = (this_00->cmp).this;
        pvVar6 = (this_00->cmp).privateSupertypes;
        local_60.id = (pvVar6->
                      super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar1].first.id;
        typeA.id = (pvVar6->
                   super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar2].first.id;
        iVar9 = std::
                _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(pGVar5->wasm->typeIndices)._M_h,&local_60);
        iVar10 = std::
                 _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(pGVar5->wasm->typeIndices)._M_h,&typeA);
        if ((iVar9.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
             _M_cur != (__node_type *)0x0) ==
            (iVar10.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
             _M_cur != (__node_type *)0x0)) {
          if (iVar9.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
              _M_cur != (__node_type *)0x0) {
            if ((*(long *)((long)iVar9.
                                 super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                 ._M_cur + 8) !=
                 *(long *)((long)iVar10.
                                 super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                 ._M_cur + 8)) ||
               (*(uint *)((long)iVar9.
                                super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                ._M_cur + 0x10) !=
                *(uint *)((long)iVar10.
                                super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                ._M_cur + 0x10))) {
              bVar17 = *(uint *)((long)iVar10.
                                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                       ._M_cur + 0x10) <=
                       *(uint *)((long)iVar9.
                                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                       ._M_cur + 0x10);
              goto LAB_0074379c;
            }
          }
          bVar17 = uVar2 < uVar1;
        }
        else {
          bVar17 = iVar9.
                   super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
                   _M_cur == (__node_type *)0x0;
        }
LAB_0074379c:
      } while ((bVar17) &&
              (puVar3[lVar16] = puVar3[lVar12], bVar17 = 2 < lVar16, lVar16 = lVar12, bVar17));
    }
    puVar3[lVar16] = uVar1;
  }
  puVar3 = (this_00->buf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this_00->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar1 = puVar4[-1];
  (this_00->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar4 + -1;
  puVar3[this->start] = uVar1;
  uVar1 = this->start;
  uVar2 = puVar3[uVar1];
  pvVar7 = (this_00->graph->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar13 = *(uint **)&pvVar7[uVar2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl;
  puVar8 = *(pointer *)
            ((long)&pvVar7[uVar2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl + 8);
  while( true ) {
    if (puVar13 == puVar8) {
      return uVar1 + 1;
    }
    uVar2 = *puVar13;
    puVar3 = (this_00->indegrees).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar11 = puVar3[uVar2];
    if (uVar11 == 0) break;
    uVar11 = uVar11 - 1;
    puVar3[uVar2] = uVar11;
    if (uVar11 == 0) {
      pushChoice(this_00,uVar2);
    }
    puVar13 = puVar13 + 1;
  }
  __assert_fail("ctx.indegrees[child] > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                ,0xea,
                "Selector wasm::TopologicalOrdersImpl<(lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector::select(TopologicalOrdersImpl<F> &) [Cmp = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)]"
               );
}

Assistant:

Selector select(TopologicalOrdersImpl& ctx) {
      assert(count >= 1);
      assert(start + count <= ctx.buf.size());
      if constexpr (TopologicalOrdersImpl::useMinHeap) {
        ctx.buf[start] = ctx.popChoice();
      }
      auto selection = ctx.buf[start];
      // The next selector will select the next index and will not be able to
      // choose the vertex we just selected.
      Selector next = {start + 1, count - 1, 0};
      // Append any child that this selection makes available to the choices for
      // the next selector.
      for (auto child : ctx.graph[selection]) {
        assert(ctx.indegrees[child] > 0);
        if (--ctx.indegrees[child] == 0) {
          if constexpr (TopologicalOrdersImpl::useMinHeap) {
            ctx.pushChoice(child);
          } else {
            ctx.buf[next.start + next.count] = child;
          }
          ++next.count;
        }
      }
      return next;
    }